

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int countint(TValue *key,uint *nums)

{
  uint x;
  int iVar1;
  uint k;
  uint *nums_local;
  TValue *key_local;
  
  x = arrayindex(key);
  if (x != 0) {
    iVar1 = luaO_ceillog2(x);
    nums[iVar1] = nums[iVar1] + 1;
  }
  key_local._4_4_ = (uint)(x != 0);
  return key_local._4_4_;
}

Assistant:

static int countint (const TValue *key, unsigned int *nums) {
  unsigned int k = arrayindex(key);
  if (k != 0) {  /* is 'key' an appropriate array index? */
    nums[luaO_ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}